

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

int filemgr_is_writable(filemgr *file,bid_t bid)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  
  if ((file->sb == (superblock *)0x0) ||
     (bVar1 = 1, (file->sb->bmp_size).super___atomic_base<unsigned_long>._M_i == 0)) {
    bVar1 = 0;
  }
  if ((bool)(sb_ops.is_writable != (_func_bool_filemgr_ptr_bid_t *)0x0 & bVar1)) {
    bVar2 = (*sb_ops.is_writable)(file,bid);
  }
  else {
    uVar3 = file->blocksize * bid;
    if (uVar3 < (file->pos).super___atomic_base<unsigned_long>._M_i) {
      bVar2 = (file->last_commit).super___atomic_base<unsigned_long>._M_i <= uVar3;
    }
    else {
      bVar2 = false;
    }
  }
  return (int)bVar2;
}

Assistant:

int filemgr_is_writable(struct filemgr *file, bid_t bid)
{
    if (sb_bmp_exists(file->sb) && sb_ops.is_writable) {
        // block reusing is enabled
        return sb_ops.is_writable(file, bid);
    } else {
        uint64_t pos = bid * file->blocksize;
        // Note that we don't need to grab file->lock here because
        // 1) both file->pos and file->last_commit are only incremented.
        // 2) file->last_commit is updated using the value of file->pos,
        //    and always equal to or smaller than file->pos.
        return (pos <  atomic_get_uint64_t(&file->pos) &&
                pos >= atomic_get_uint64_t(&file->last_commit));
    }
}